

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O2

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r,uint16_t n,uint16_t k,uint16_t ref)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  int iVar3;
  uint16_t uVar4;
  undefined6 in_register_00000032;
  uint uVar5;
  int iVar6;
  int iVar7;
  int local_38;
  
  iVar6 = 0;
  iVar7 = 0;
  while( true ) {
    local_38 = (int)CONCAT62(in_register_00000012,k);
    iVar3 = (int)CONCAT62(in_register_00000012,k) + -1 + iVar7;
    if (iVar7 == 0) {
      iVar3 = local_38;
    }
    uVar5 = (uint)CONCAT62(in_register_00000032,n);
    if ((int)uVar5 <= (3 << ((byte)iVar3 & 0x1f)) + iVar6) break;
    iVar1 = aom_read_bit_(r);
    if (iVar1 == 0) {
      iVar7 = aom_read_literal_(r,iVar3);
LAB_002424df:
      uVar4 = (short)iVar7 + (short)iVar6;
      if (uVar5 < (uint)ref * 2) {
        uVar4 = inv_recenter_nonneg((n - 1) - ref,uVar4);
        return (n - 1) - uVar4;
      }
      uVar4 = inv_recenter_nonneg(ref,uVar4);
      return uVar4;
    }
    iVar7 = iVar7 + 1;
    iVar6 = iVar6 + (1 << ((byte)iVar3 & 0x1f));
  }
  if ((ushort)(uVar5 - iVar6) < 2) {
    iVar7 = 0;
  }
  else {
    uVar2 = uVar5 - iVar6 & 0xffff;
    iVar7 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    iVar3 = (2 << ((byte)iVar7 & 0x1f)) - uVar2;
    iVar7 = aom_read_literal_(r,iVar7);
    if (iVar3 <= iVar7) {
      iVar1 = aom_read_bit_(r);
      iVar7 = (iVar7 * 2 - iVar3) + iVar1;
    }
  }
  goto LAB_002424df;
}

Assistant:

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r, uint16_t n, uint16_t k,
                                          uint16_t ref ACCT_STR_PARAM) {
  return inv_recenter_finite_nonneg(
      n, ref, read_primitive_subexpfin(r, n, k, ACCT_STR_NAME));
}